

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

bool __thiscall QHostInfoLookupManager::wasAborted(QHostInfoLookupManager *this,int id)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 local_1d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  if ((*(byte *)(in_RDI + 0xe8) & 1) == 0) {
    local_1d = QListSpecialMethodsBase<int>::contains<int>
                         ((QListSpecialMethodsBase<int> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          (int *)in_stack_ffffffffffffffb8);
  }
  else {
    local_1d = true;
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1d;
  }
  __stack_chk_fail();
}

Assistant:

bool QHostInfoLookupManager::wasAborted(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return true;

    return abortedLookups.contains(id);
}